

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void reshape(GLFWwindow *window,int width,int height)

{
  int local_30;
  int local_2c;
  int w;
  int h;
  
  glfwGetFramebufferSize(window,&local_30,&local_2c);
  glViewport(0,0,local_30,local_2c);
  glMatrixMode(0x1701);
  glLoadIdentity();
  glOrtho(0,(double)width,(double)height,0,0,0x3ff0000000000000);
  glMatrixMode(0x1700);
  glLoadIdentity();
  return;
}

Assistant:

void reshape(GLFWwindow* window, int width, int height ) {
    int w, h;
    glfwGetFramebufferSize(window, &w, &h);
    glViewport(0, 0, w, h);
    glMatrixMode(GL_PROJECTION );
    glLoadIdentity();
    glOrtho(0, width, height, 0, 0, 1);
    glMatrixMode(GL_MODELVIEW );
    glLoadIdentity();
}